

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

uchar * sqlite3_serialize(sqlite3 *db,char *zSchema,sqlite3_int64 *piSize,uint mFlags)

{
  sqlite3_int64 sVar1;
  char *__s;
  void *__src;
  int local_ac;
  uchar *pTo;
  DbPage *pPage;
  Pager *pPStack_90;
  int pgno;
  Pager *pPager;
  MemStore *pMStack_80;
  int nPage;
  MemStore *pStore;
  char *pcStack_70;
  int rc;
  char *zSql;
  uchar *pOut;
  sqlite3_stmt *pStmt;
  sqlite3_uint64 sStack_50;
  int szPage;
  sqlite3_int64 sz;
  Btree *pBt;
  MemFile *pMStack_38;
  int iDb;
  MemFile *p;
  sqlite3_uint64 *psStack_28;
  uint mFlags_local;
  sqlite3_int64 *piSize_local;
  char *zSchema_local;
  sqlite3 *db_local;
  
  pStmt._4_4_ = 0;
  pOut = (uchar *)0x0;
  piSize_local = (sqlite3_int64 *)zSchema;
  if (zSchema == (char *)0x0) {
    piSize_local = (sqlite3_int64 *)db->aDb->zDbSName;
  }
  p._4_4_ = mFlags;
  psStack_28 = (sqlite3_uint64 *)piSize;
  zSchema_local = (char *)db;
  pMStack_38 = memdbFromDbSchema(db,(char *)piSize_local);
  pBt._4_4_ = sqlite3FindDbName((sqlite3 *)zSchema_local,(char *)piSize_local);
  if (psStack_28 != (sqlite3_uint64 *)0x0) {
    *psStack_28 = 0xffffffffffffffff;
  }
  if (pBt._4_4_ < 0) {
    db_local = (sqlite3 *)0x0;
  }
  else if (pMStack_38 == (MemFile *)0x0) {
    sz = *(undefined8 *)(*(long *)(zSchema_local + 0x20) + (long)pBt._4_4_ * 0x20 + 8);
    if ((Btree *)sz == (Btree *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      pStmt._4_4_ = sqlite3BtreeGetPageSize((Btree *)sz);
      pcStack_70 = sqlite3_mprintf("PRAGMA \"%w\".page_count");
      if (pcStack_70 == (char *)0x0) {
        local_ac = 7;
      }
      else {
        local_ac = sqlite3_prepare_v2((sqlite3 *)zSchema_local,pcStack_70,-1,(sqlite3_stmt **)&pOut,
                                      (char **)0x0);
      }
      pStore._4_4_ = local_ac;
      sqlite3_free(pcStack_70);
      if (pStore._4_4_ == 0) {
        pStore._4_4_ = sqlite3_step((sqlite3_stmt *)pOut);
        if (pStore._4_4_ == 100) {
          sVar1 = sqlite3_column_int64((sqlite3_stmt *)pOut,0);
          sStack_50 = sVar1 * pStmt._4_4_;
          if (sStack_50 == 0) {
            sqlite3_reset((sqlite3_stmt *)pOut);
            sqlite3_exec((sqlite3 *)zSchema_local,"BEGIN IMMEDIATE; COMMIT;",(sqlite3_callback)0x0,
                         (void *)0x0,(char **)0x0);
            pStore._4_4_ = sqlite3_step((sqlite3_stmt *)pOut);
            if (pStore._4_4_ == 100) {
              sVar1 = sqlite3_column_int64((sqlite3_stmt *)pOut,0);
              sStack_50 = sVar1 * pStmt._4_4_;
            }
          }
          if (psStack_28 != (sqlite3_uint64 *)0x0) {
            *psStack_28 = sStack_50;
          }
          if ((p._4_4_ & 1) == 0) {
            zSql = (char *)sqlite3_malloc64(sStack_50);
            if (zSql != (char *)0x0) {
              pPager._4_4_ = sqlite3_column_int((sqlite3_stmt *)pOut,0);
              pPStack_90 = sqlite3BtreePager((Btree *)sz);
              for (pPage._4_4_ = 1; (int)pPage._4_4_ <= pPager._4_4_; pPage._4_4_ = pPage._4_4_ + 1)
              {
                pTo = (uchar *)0x0;
                __s = zSql + (long)pStmt._4_4_ * (long)(int)(pPage._4_4_ - 1);
                pStore._4_4_ = sqlite3PagerGet(pPStack_90,pPage._4_4_,(DbPage **)&pTo,0);
                if (pStore._4_4_ == 0) {
                  __src = sqlite3PagerGetData((DbPage *)pTo);
                  memcpy(__s,__src,(long)pStmt._4_4_);
                }
                else {
                  memset(__s,0,(long)pStmt._4_4_);
                }
                sqlite3PagerUnref((DbPage *)pTo);
              }
            }
          }
          else {
            zSql = (char *)0x0;
          }
        }
        else {
          zSql = (char *)0x0;
        }
        sqlite3_finalize((sqlite3_stmt *)pOut);
        db_local = (sqlite3 *)zSql;
      }
      else {
        db_local = (sqlite3 *)0x0;
      }
    }
  }
  else {
    pMStack_80 = pMStack_38->pStore;
    if (psStack_28 != (sqlite3_uint64 *)0x0) {
      *psStack_28 = pMStack_80->sz;
    }
    if ((p._4_4_ & 1) == 0) {
      zSql = (char *)sqlite3_malloc64(pMStack_80->sz);
      if (zSql != (char *)0x0) {
        memcpy(zSql,pMStack_80->aData,pMStack_80->sz);
      }
    }
    else {
      zSql = (char *)pMStack_80->aData;
    }
    db_local = (sqlite3 *)zSql;
  }
  return (uchar *)db_local;
}

Assistant:

SQLITE_API unsigned char *sqlite3_serialize(
  sqlite3 *db,              /* The database connection */
  const char *zSchema,      /* Which database within the connection */
  sqlite3_int64 *piSize,    /* Write size here, if not NULL */
  unsigned int mFlags       /* Maybe SQLITE_SERIALIZE_NOCOPY */
){
  MemFile *p;
  int iDb;
  Btree *pBt;
  sqlite3_int64 sz;
  int szPage = 0;
  sqlite3_stmt *pStmt = 0;
  unsigned char *pOut;
  char *zSql;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  p = memdbFromDbSchema(db, zSchema);
  iDb = sqlite3FindDbName(db, zSchema);
  if( piSize ) *piSize = -1;
  if( iDb<0 ) return 0;
  if( p ){
    MemStore *pStore = p->pStore;
    assert( pStore->pMutex==0 );
    if( piSize ) *piSize = pStore->sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = pStore->aData;
    }else{
      pOut = sqlite3_malloc64( pStore->sz );
      if( pOut ) memcpy(pOut, pStore->aData, pStore->sz);
    }
    return pOut;
  }
  pBt = db->aDb[iDb].pBt;
  if( pBt==0 ) return 0;
  szPage = sqlite3BtreeGetPageSize(pBt);
  zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count", zSchema);
  rc = zSql ? sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0) : SQLITE_NOMEM;
  sqlite3_free(zSql);
  if( rc ) return 0;
  rc = sqlite3_step(pStmt);
  if( rc!=SQLITE_ROW ){
    pOut = 0;
  }else{
    sz = sqlite3_column_int64(pStmt, 0)*szPage;
    if( sz==0 ){
      sqlite3_reset(pStmt);
      sqlite3_exec(db, "BEGIN IMMEDIATE; COMMIT;", 0, 0, 0);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        sz = sqlite3_column_int64(pStmt, 0)*szPage;
      }
    }
    if( piSize ) *piSize = sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = 0;
    }else{
      pOut = sqlite3_malloc64( sz );
      if( pOut ){
        int nPage = sqlite3_column_int(pStmt, 0);
        Pager *pPager = sqlite3BtreePager(pBt);
        int pgno;
        for(pgno=1; pgno<=nPage; pgno++){
          DbPage *pPage = 0;
          unsigned char *pTo = pOut + szPage*(sqlite3_int64)(pgno-1);
          rc = sqlite3PagerGet(pPager, pgno, (DbPage**)&pPage, 0);
          if( rc==SQLITE_OK ){
            memcpy(pTo, sqlite3PagerGetData(pPage), szPage);
          }else{
            memset(pTo, 0, szPage);
          }
          sqlite3PagerUnref(pPage);
        }
      }
    }
  }
  sqlite3_finalize(pStmt);
  return pOut;
}